

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O0

void __thiscall
crnlib::
hash_map<crnlib::vec<16U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<16U,_float>_>,_crnlib::equal_to<crnlib::vec<16U,_float>_>_>
::move_into(hash_map<crnlib::vec<16U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<16U,_float>_>,_crnlib::equal_to<crnlib::vec<16U,_float>_>_>
            *this,node *pNode)

{
  uint8 uVar1;
  uint uVar2;
  node *pnVar3;
  node *in_RDI;
  int orig_index;
  node *pDst_node;
  int index;
  undefined4 in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  hash_map<crnlib::vec<16U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<16U,_float>_>,_crnlib::equal_to<crnlib::vec<16U,_float>_>_>
  *in_stack_ffffffffffffffe0;
  uint local_14;
  
  uVar2 = hash_key(in_stack_ffffffffffffffe0,
                   (vec<16U,_float> *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8))
  ;
  pnVar3 = get_node((hash_map<crnlib::vec<16U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<16U,_float>_>,_crnlib::equal_to<crnlib::vec<16U,_float>_>_>
                     *)in_RDI,in_stack_ffffffffffffffcc);
  uVar1 = pnVar3->state;
  local_14 = uVar2;
  while( true ) {
    if (uVar1 == '\0') {
      move_node(in_RDI,(node *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      (in_RDI->super_value_type).first.m_s[6] =
           (float)((int)(in_RDI->super_value_type).first.m_s[6] + 1);
      return;
    }
    if (local_14 == 0) {
      local_14 = vector<crnlib::hash_map<crnlib::vec<16U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<16U,_float>_>,_crnlib::equal_to<crnlib::vec<16U,_float>_>_>::raw_node>
                 ::size((vector<crnlib::hash_map<crnlib::vec<16U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<16U,_float>_>,_crnlib::equal_to<crnlib::vec<16U,_float>_>_>::raw_node>
                         *)in_RDI);
      pnVar3 = get_node((hash_map<crnlib::vec<16U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<16U,_float>_>,_crnlib::equal_to<crnlib::vec<16U,_float>_>_>
                         *)in_RDI,in_stack_ffffffffffffffcc);
    }
    else {
      pnVar3 = pnVar3 + -1;
    }
    local_14 = local_14 - 1;
    if (local_14 == uVar2) break;
    uVar1 = pnVar3->state;
  }
  return;
}

Assistant:

inline void move_into(node* pNode) {
    int index = hash_key(pNode->first);
    node* pDst_node = &get_node(index);

    if (pDst_node->state) {
      const int orig_index = index;

      for (;;) {
        if (!index) {
          index = m_values.size() - 1;
          pDst_node = &get_node(index);
        } else {
          index--;
          pDst_node--;
        }

        if (index == orig_index) {
          CRNLIB_ASSERT(false);
          return;
        }

        if (!pDst_node->state)
          break;
      }
    }

    move_node(pDst_node, pNode);

    m_num_valid++;
  }